

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O3

double __thiscall
anon_unknown.dwarf_1f808::sampleX<unsigned_int>
          (anon_unknown_dwarf_1f808 *this,TypedImageChannel<unsigned_int> *channel,int w,double x,
          int y,Extrapolation ext)

{
  uint x_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  
  if (0.0 <= x) {
    uVar7 = (uint)x;
  }
  else {
    dVar8 = -x;
    uVar7 = -((uint)((double)(int)dVar8 < dVar8) + (int)dVar8);
  }
  x_00 = uVar7 + 1;
  uVar6 = (ulong)x_00;
  switch(ext) {
  case BLACK:
    dVar9 = 0.0;
    dVar8 = 0.0;
    if ((int)uVar7 < w && -1 < (int)uVar7) {
      dVar8 = (double)*(uint *)((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                               (ulong)uVar7 * 4 + (long)y * (long)this * 4);
    }
    if (w <= (int)x_00 || (int)uVar7 < -1) goto LAB_00109a9d;
    lVar4 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    break;
  case CLAMP:
    uVar2 = w - 1;
    uVar3 = uVar2;
    if ((int)uVar7 < (int)uVar2) {
      uVar3 = uVar7;
    }
    if ((int)uVar7 < 0) {
      uVar3 = 0;
    }
    if ((int)x_00 < (int)uVar2) {
      uVar2 = x_00;
    }
    if ((int)uVar7 < -1) {
      uVar2 = 0;
    }
    lVar4 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    uVar7 = *(uint *)(lVar4 + (long)(int)uVar3 * 4);
    goto LAB_00109a04;
  case PERIODIC:
    if ((int)uVar7 < 0) {
      if (-1 < w) {
        uVar2 = ((~uVar7 + w) - (~uVar7 + w) % (uint)w) + uVar7;
        if (uVar7 != 0xffffffff) {
          uVar7 = ((w - uVar7) - 2) / (uint)w;
          goto LAB_00109a69;
        }
        goto LAB_00109980;
      }
      uVar2 = uVar7 - ((~w - uVar7) / (uint)-w) * w;
      if (uVar7 == 0xffffffff) goto LAB_00109a62;
      uVar7 = (~w - x_00) / (uint)-w;
    }
    else if (w < 0) {
      uVar2 = uVar7 + (uVar7 / (uint)-w) * w;
LAB_00109a62:
      uVar7 = x_00 / (uint)-w;
LAB_00109a69:
      uVar7 = -uVar7;
    }
    else {
      uVar2 = uVar7 % (uint)w;
LAB_00109980:
      uVar7 = x_00 / (uint)w;
    }
    lVar4 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    dVar8 = (double)*(uint *)(lVar4 + (long)(int)uVar2 * 4);
    uVar6 = (ulong)(int)(x_00 - uVar7 * w);
    break;
  case MIRROR:
    iVar1 = mirror(uVar7,w);
    uVar2 = mirror(x_00,w);
    lVar4 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 4;
    uVar7 = *(uint *)(lVar4 + (long)iVar1 * 4);
LAB_00109a04:
    dVar8 = (double)uVar7;
    puVar5 = (uint *)(lVar4 + (long)(int)uVar2 * 4);
    goto LAB_00109a93;
  default:
    dVar8 = 0.0;
    dVar9 = 0.0;
    goto LAB_00109a9d;
  }
  puVar5 = (uint *)(lVar4 + uVar6 * 4);
LAB_00109a93:
  dVar9 = (double)*puVar5;
LAB_00109a9d:
  return ((double)(int)x_00 - x) * dVar8 + (1.0 - ((double)(int)x_00 - x)) * dVar9;
}

Assistant:

double
sampleX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is a floating point number, and y is an integer.
    //

    int    xs = IMATH_NAMESPACE::floor (x);
    int    xt = xs + 1;
    double s  = xt - x;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (xs >= 0 && xs < w) ? double (channel (xs, y)) : 0.0;
            vt = (xt >= 0 && xt < w) ? double (channel (xt, y)) : 0.0;
            break;

        case CLAMP:

            xs = IMATH_NAMESPACE::clamp (xs, 0, w - 1);
            xt = IMATH_NAMESPACE::clamp (xt, 0, w - 1);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case PERIODIC:

            xs = modp (xs, w);
            xt = modp (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case MIRROR:

            xs = mirror (xs, w);
            xt = mirror (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;
    }

    return s * vs + t * vt;
}